

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_req_make(httpreq **preq,char *method,size_t m_len,char *scheme,size_t s_len,
                           char *authority,size_t a_len,char *path,size_t p_len)

{
  char *pcVar1;
  httpreq *local_58;
  CURLcode local_4c;
  CURLcode result;
  httpreq *req;
  char *authority_local;
  size_t s_len_local;
  char *scheme_local;
  size_t m_len_local;
  char *method_local;
  httpreq **preq_local;
  
  local_4c = CURLE_OUT_OF_MEMORY;
  if (0x18 < m_len + 1) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  local_58 = (httpreq *)(*Curl_ccalloc)(1,0xa0);
  if (local_58 != (httpreq *)0x0) {
    memcpy(local_58,method,m_len);
    if (scheme != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(scheme,s_len);
      local_58->scheme = pcVar1;
      if (local_58->scheme == (char *)0x0) goto LAB_00151fa3;
    }
    if (authority != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(authority,a_len);
      local_58->authority = pcVar1;
      if (local_58->authority == (char *)0x0) goto LAB_00151fa3;
    }
    if (path != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(path,p_len);
      local_58->path = pcVar1;
      if (local_58->path == (char *)0x0) goto LAB_00151fa3;
    }
    Curl_dynhds_init(&local_58->headers,0,0x100000);
    Curl_dynhds_init(&local_58->trailers,0,0x100000);
    local_4c = CURLE_OK;
  }
LAB_00151fa3:
  if ((local_4c != CURLE_OK) && (local_58 != (httpreq *)0x0)) {
    Curl_http_req_free(local_58);
  }
  if (local_4c != CURLE_OK) {
    local_58 = (httpreq *)0x0;
  }
  *preq = local_58;
  return local_4c;
}

Assistant:

CURLcode Curl_http_req_make(struct httpreq **preq,
                            const char *method, size_t m_len,
                            const char *scheme, size_t s_len,
                            const char *authority, size_t a_len,
                            const char *path, size_t p_len)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(method);
  if(m_len + 1 > sizeof(req->method))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  req = calloc(1, sizeof(*req));
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);
  if(scheme) {
    req->scheme = Curl_memdup0(scheme, s_len);
    if(!req->scheme)
      goto out;
  }
  if(authority) {
    req->authority = Curl_memdup0(authority, a_len);
    if(!req->authority)
      goto out;
  }
  if(path) {
    req->path = Curl_memdup0(path, p_len);
    if(!req->path)
      goto out;
  }
  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result ? NULL : req;
  return result;
}